

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# license-generator.cpp
# Opt level: O0

vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> *
license::LicenseGenerator::parseLicenseInfo
          (vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
           *__return_storage_ptr__,variables_map *vm)

{
  uint uVar1;
  undefined *puVar2;
  undefined8 uVar3;
  bool bVar4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  *pmVar5;
  size_type sVar6;
  variable_value *pvVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  ostream *poVar9;
  uint *puVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  size_type __n;
  reference pbVar11;
  long lVar12;
  tm *in_RCX;
  string local_560;
  string local_540;
  allocator local_519;
  undefined1 local_518 [40];
  string local_4f0;
  FullLicenseInfo local_4d0;
  undefined1 local_3d0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3a8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3a0;
  iterator it;
  string local_390;
  undefined1 local_370 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  products;
  key_type local_350;
  allocator local_329;
  string local_328;
  uint local_308;
  allocator local_301;
  uint to_sw_version;
  uint local_2e0;
  allocator local_2d9;
  uint from_sw_version;
  allocator local_2b1;
  key_type local_2b0;
  allocator local_289;
  undefined1 local_288 [8];
  string extra_data;
  regex e_2;
  string local_240;
  allocator local_219;
  key_type local_218;
  allocator local_1f1;
  undefined1 local_1f0 [8];
  string client_signature;
  invalid_argument *e_1;
  allocator local_1a1;
  string local_1a0;
  undefined1 local_180 [8];
  string begin_date_str;
  key_type local_158;
  invalid_argument *e;
  time_t curtime;
  char curdate [20];
  string local_108;
  allocator local_e1;
  string local_e0;
  undefined1 local_c0 [8];
  string dt_end;
  key_type local_98;
  allocator local_71;
  string local_70 [8];
  string end_date;
  allocator local_39;
  string local_38 [8];
  string begin_date;
  variables_map *vm_local;
  vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> *licInfo;
  
  puVar2 = FullLicenseInfo::UNUSED_TIME;
  begin_date.field_2._8_8_ = vm;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,puVar2,&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  puVar2 = FullLicenseInfo::UNUSED_TIME;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,puVar2,&local_71);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  pmVar5 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            *)(begin_date.field_2._8_8_ + 0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_98,"expire_date",(allocator *)(dt_end.field_2._M_local_buf + 0xf));
  sVar6 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(pmVar5,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)(dt_end.field_2._M_local_buf + 0xf));
  uVar3 = begin_date.field_2._8_8_;
  if (sVar6 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_e0,"expire_date",&local_e1);
    pvVar7 = boost::program_options::variables_map::operator[]((variables_map *)uVar3,&local_e0);
    pbVar8 = boost::program_options::variable_value::as<std::__cxx11::string>(pvVar7);
    std::__cxx11::string::string((string *)local_c0,(string *)pbVar8);
    std::__cxx11::string::~string((string *)&local_e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_e1);
    normalize_date(&local_108,(string *)local_c0);
    std::__cxx11::string::operator=(local_70,(string *)&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    e = (invalid_argument *)time((time_t *)0x0);
    in_RCX = localtime((time_t *)&e);
    strftime((char *)&curtime,0x14,"%Y-%m-%d",in_RCX);
    std::__cxx11::string::assign((char *)local_38);
    std::__cxx11::string::~string((string *)local_c0);
  }
  pmVar5 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            *)(begin_date.field_2._8_8_ + 0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_158,"begin_date",
             (allocator *)(begin_date_str.field_2._M_local_buf + 0xf));
  sVar6 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(pmVar5,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator((allocator<char> *)(begin_date_str.field_2._M_local_buf + 0xf));
  uVar3 = begin_date.field_2._8_8_;
  if (sVar6 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1a0,"begin_date",&local_1a1);
    pvVar7 = boost::program_options::variables_map::operator[]((variables_map *)uVar3,&local_1a0);
    pbVar8 = boost::program_options::variable_value::as<std::__cxx11::string>(pvVar7);
    std::__cxx11::string::string((string *)local_180,(string *)pbVar8);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
    normalize_date((string *)&e_1,(string *)local_180);
    std::__cxx11::string::operator=(local_38,(string *)&e_1);
    std::__cxx11::string::~string((string *)&e_1);
    std::__cxx11::string::~string((string *)local_180);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_1f0,"",&local_1f1);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
  pmVar5 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            *)(begin_date.field_2._8_8_ + 0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_218,"client_signature",&local_219);
  sVar6 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(pmVar5,&local_218);
  std::__cxx11::string::~string((string *)&local_218);
  std::allocator<char>::~allocator((allocator<char> *)&local_219);
  uVar3 = begin_date.field_2._8_8_;
  if (sVar6 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_240,"client_signature",
               (allocator *)
               ((long)&e_2._M_automaton.
                       super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi + 7));
    pvVar7 = boost::program_options::variables_map::operator[]((variables_map *)uVar3,&local_240);
    pbVar8 = boost::program_options::variable_value::as<std::__cxx11::string>(pvVar7);
    std::__cxx11::string::operator=((string *)local_1f0,(string *)pbVar8);
    std::__cxx11::string::~string((string *)&local_240);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&e_2._M_automaton.
                       super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi + 7));
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
               ((long)&extra_data.field_2 + 8),
               "[A-Za-z0-9\\+/]{4}-[A-Za-z0-9\\+/]{4}-[A-Za-z0-9\\+/]{4}-[A-Za-z0-9\\+/]{4}",0x10);
    bVar4 = std::
            regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1f0,
                       (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                       ((long)&extra_data.field_2 + 8),0);
    if (!bVar4) {
      poVar9 = (ostream *)
               std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
      poVar9 = std::operator<<(poVar9,"Client signature not recognized: ");
      poVar9 = std::operator<<(poVar9,(string *)local_1f0);
      poVar9 = std::operator<<(poVar9,
                               " Please enter a valid signature in format XXXX-XXXX-XXXX-XXXX");
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      exit(2);
    }
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
               ((long)&extra_data.field_2 + 8));
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_288,"",&local_289);
  std::allocator<char>::~allocator((allocator<char> *)&local_289);
  pmVar5 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            *)(begin_date.field_2._8_8_ + 0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2b0,"extra_data",&local_2b1);
  sVar6 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(pmVar5,&local_2b0);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
  uVar3 = begin_date.field_2._8_8_;
  if (sVar6 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&from_sw_version,"extra_data",&local_2d9);
    pvVar7 = boost::program_options::variables_map::operator[]
                       ((variables_map *)uVar3,(string *)&from_sw_version);
    pbVar8 = boost::program_options::variable_value::as<std::__cxx11::string>(pvVar7);
    std::__cxx11::string::operator=((string *)local_288,(string *)pbVar8);
    std::__cxx11::string::~string((string *)&from_sw_version);
    std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
  }
  uVar3 = begin_date.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&to_sw_version,"start_version",&local_301);
  pvVar7 = boost::program_options::variables_map::operator[]
                     ((variables_map *)uVar3,(string *)&to_sw_version);
  puVar10 = boost::program_options::variable_value::as<unsigned_int>(pvVar7);
  uVar1 = *puVar10;
  std::__cxx11::string::~string((string *)&to_sw_version);
  std::allocator<char>::~allocator((allocator<char> *)&local_301);
  uVar3 = begin_date.field_2._8_8_;
  local_2e0 = uVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_328,"end_version",&local_329);
  pvVar7 = boost::program_options::variables_map::operator[]((variables_map *)uVar3,&local_328);
  puVar10 = boost::program_options::variable_value::as<unsigned_int>(pvVar7);
  uVar1 = *puVar10;
  std::__cxx11::string::~string((string *)&local_328);
  std::allocator<char>::~allocator((allocator<char> *)&local_329);
  pmVar5 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            *)(begin_date.field_2._8_8_ + 0x10);
  local_308 = uVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_350,"product",
             (allocator *)
             ((long)&products.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  sVar6 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(pmVar5,&local_350);
  std::__cxx11::string::~string((string *)&local_350);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&products.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  uVar3 = begin_date.field_2._8_8_;
  if (sVar6 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_390,"product",(allocator *)((long)&it._M_current + 7));
    pvVar7 = boost::program_options::variables_map::operator[]((variables_map *)uVar3,&local_390);
    __x = boost::program_options::variable_value::
          as<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>(pvVar7);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_370,__x);
    std::__cxx11::string::~string((string *)&local_390);
    std::allocator<char>::~allocator((allocator<char> *)((long)&it._M_current + 7));
    it._M_current._6_1_ = 0;
    std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>::vector
              (__return_storage_ptr__);
    __n = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_370);
    std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>::reserve
              (__return_storage_ptr__,__n);
    local_3a0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_370);
    while( true ) {
      local_3a8._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_370);
      bVar4 = __gnu_cxx::operator!=(&local_3a0,&local_3a8);
      if (!bVar4) break;
      pbVar11 = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&local_3a0);
      std::locale::locale((locale *)local_3d0);
      boost::algorithm::trim_copy<std::__cxx11::string>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_3d0 + 8),(algorithm *)pbVar11,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3d0,
                 (locale *)in_RCX);
      lVar12 = std::__cxx11::string::length();
      std::__cxx11::string::~string((string *)(local_3d0 + 8));
      std::locale::~locale((locale *)local_3d0);
      if (lVar12 != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_4f0,"",(allocator *)(local_518 + 0x27));
        pbVar11 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&local_3a0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)local_518,"",&local_519);
        std::__cxx11::string::string((string *)&local_540,local_38);
        std::__cxx11::string::string((string *)&local_560,local_70);
        in_RCX = (tm *)local_518;
        FullLicenseInfo::FullLicenseInfo
                  (&local_4d0,&local_4f0,pbVar11,(string *)in_RCX,0x6e,&local_540,&local_560,
                   (string *)local_1f0,local_2e0,local_308,(string *)local_288);
        std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>::push_back
                  (__return_storage_ptr__,&local_4d0);
        FullLicenseInfo::~FullLicenseInfo(&local_4d0);
        std::__cxx11::string::~string((string *)&local_560);
        std::__cxx11::string::~string((string *)&local_540);
        std::__cxx11::string::~string((string *)local_518);
        std::allocator<char>::~allocator((allocator<char> *)&local_519);
        std::__cxx11::string::~string((string *)&local_4f0);
        std::allocator<char>::~allocator((allocator<char> *)(local_518 + 0x27));
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_3a0,0);
    }
    it._M_current._6_1_ = 1;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_370);
    std::__cxx11::string::~string((string *)local_288);
    std::__cxx11::string::~string((string *)local_1f0);
    std::__cxx11::string::~string(local_70);
    std::__cxx11::string::~string(local_38);
    return __return_storage_ptr__;
  }
  poVar9 = (ostream *)std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
  poVar9 = std::operator<<(poVar9,"Parameter [product] not found. ");
  std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
  exit(2);
}

Assistant:

vector<FullLicenseInfo> LicenseGenerator::parseLicenseInfo(
		const po::variables_map& vm) {
	string begin_date = FullLicenseInfo::UNUSED_TIME;
	string end_date = FullLicenseInfo::UNUSED_TIME;
	if (vm.count("expire_date")) {
		const std::string dt_end = vm["expire_date"].as<string>();
		try {
			end_date = normalize_date(dt_end);
			char curdate[20];
			time_t curtime = time(NULL);
			strftime(curdate, 20, "%Y-%m-%d", localtime(&curtime));
			begin_date.assign(curdate);
		} catch (const invalid_argument &e) {
			cerr << endl << "End date not recognized: " << dt_end
					<< " Please enter a valid date in format YYYYMMDD" << endl;
			exit(2);
		}
	}
	if (vm.count("begin_date")) {
		const std::string begin_date_str = vm["begin_date"].as<string>();
		try {
			begin_date = normalize_date(begin_date_str);
		} catch (invalid_argument &e) {
			cerr << endl << "Begin date not recognized: " << begin_date_str
					<< " Please enter a valid date in format YYYYMMDD" << endl;
			//print_usage(vm);
			exit(2);
		}
	}
	string client_signature = "";
	if (vm.count("client_signature")) {
		client_signature = vm["client_signature"].as<string>();
		regex e("[A-Za-z0-9\\+/]{4}-[A-Za-z0-9\\+/]{4}-[A-Za-z0-9\\+/]{4}-[A-Za-z0-9\\+/]{4}");
		if (!regex_match(client_signature, e)) {
			cerr << endl << "Client signature not recognized: "
				<< client_signature
				<< " Please enter a valid signature in format XXXX-XXXX-XXXX-XXXX"
				<< endl;
			exit(2);
		}
	}
	string extra_data = "";
	if (vm.count("extra_data")) {
		extra_data = vm["extra_data"].as<string>();
	}
	unsigned int from_sw_version = vm["start_version"].as<unsigned int>();
	unsigned int to_sw_version = vm["end_version"].as<unsigned int>();
	if (vm.count("product") == 0) {
		cerr << endl << "Parameter [product] not found. " << endl;
		exit(2);
	}
	vector<string> products = vm["product"].as<vector<string>>();
	vector<FullLicenseInfo> licInfo;
	licInfo.reserve(products.size());
	for (auto it = products.begin(); it != products.end(); it++) {
		if (boost::algorithm::trim_copy(*it).length() > 0) {
			licInfo.push_back(
					FullLicenseInfo("", *it, "", PROJECT_INT_VERSION,
							begin_date, end_date, client_signature,
							from_sw_version, to_sw_version, extra_data));
		}
	}
	return licInfo;
}